

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_malloc.cpp
# Opt level: O0

void Omega_h::enable_pooling(void)

{
  Pool *pPVar1;
  FreeFunc local_98;
  MallocFunc local_78;
  undefined1 local_55;
  FreeFunc local_48;
  MallocFunc local_28;
  
  pPVar1 = (Pool *)operator_new(0xc40);
  local_55 = 1;
  std::function<void*(unsigned_long)>::function<void*(&)(unsigned_long),void>
            ((function<void*(unsigned_long)> *)&local_28,device_malloc);
  std::function<void(void*,unsigned_long)>::function<void(&)(void*,unsigned_long),void>
            ((function<void(void*,unsigned_long)> *)&local_48,device_free);
  Pool::Pool(pPVar1,&local_28,&local_48);
  local_55 = 0;
  device_pool = pPVar1;
  std::function<void_(void_*,_unsigned_long)>::~function(&local_48);
  std::function<void_*(unsigned_long)>::~function(&local_28);
  pPVar1 = (Pool *)operator_new(0xc40);
  std::function<void*(unsigned_long)>::function<void*(&)(unsigned_long),void>
            ((function<void*(unsigned_long)> *)&local_78,host_malloc);
  std::function<void(void*,unsigned_long)>::function<void(&)(void*,unsigned_long),void>
            ((function<void(void*,unsigned_long)> *)&local_98,host_free);
  Pool::Pool(pPVar1,&local_78,&local_98);
  host_pool = pPVar1;
  std::function<void_(void_*,_unsigned_long)>::~function(&local_98);
  std::function<void_*(unsigned_long)>::~function(&local_78);
  return;
}

Assistant:

void enable_pooling() {
  device_pool = new Pool(device_malloc, device_free);
  host_pool = new Pool(host_malloc, host_free);
}